

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wave.cpp
# Opt level: O0

void __thiscall Wave::print_clusters(Wave *this,ofstream *out,string *filename)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int local_5ac;
  undefined1 local_5a8 [4];
  int j;
  Cluster g_1;
  undefined1 local_588 [4];
  int i_1;
  vector<double,_std::allocator<double>_> values;
  Point p;
  Cluster g;
  int i;
  int c;
  int b;
  int a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  undefined1 local_490 [8];
  string filename_gnu;
  undefined1 local_450 [8];
  string arrow_name;
  ostream local_420 [8];
  ofstream out_arrow;
  ostream local_220 [8];
  ofstream out_gnu;
  string *filename_local;
  ofstream *out_local;
  Wave *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ofstream::ofstream(local_420);
  std::__cxx11::string::find_last_of((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)((long)&filename_gnu.field_2 + 8),(ulong)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&filename_gnu.field_2 + 8),"_arrow");
  std::__cxx11::string::~string((string *)(filename_gnu.field_2._M_local_buf + 8));
  std::__cxx11::string::find_last_of((char)filename,0x2e);
  std::__cxx11::string::substr((ulong)&local_4b0,(ulong)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_490,
                 &local_4b0,"_gnu.plt");
  std::__cxx11::string::~string((string *)&local_4b0);
  std::ofstream::open(local_220,local_490,0x10);
  std::ofstream::open(local_420,local_450,0x10);
  poVar5 = std::operator<<(local_220,"rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::operator+(&local_4f0,"plot \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",filename);
  std::operator+(&local_4d0,&local_4f0,
                 "\' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable, ");
  std::operator<<(local_220,(string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
                 " \'/Users/AlinaArslanova/untitled1/cmake-build-debug/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450);
  std::operator+(&local_510,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&b,
                 "\' using 1:2:3:4 with vectors head filled  lw 2  lc rgb \"red\"");
  std::operator<<(local_220,(string *)&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&b);
  std::ofstream::open(out,filename,0x10);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Errors in opening");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  else {
    for (g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        sVar6 = std::vector<Cluster,_std::allocator<Cluster>_>::size(&this->clusters),
        (int)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage < (int)sVar6;
        g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)g.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      pvVar7 = std::vector<Cluster,_std::allocator<Cluster>_>::operator[]
                         (&this->clusters,
                          (long)(int)g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar6 = std::vector<Point,_std::allocator<Point>_>::size(&pvVar7->points);
      if (10 < sVar6) {
        pvVar7 = std::vector<Cluster,_std::allocator<Cluster>_>::operator[]
                           (&this->clusters,
                            (long)(int)g.points.super__Vector_base<Point,_std::allocator<Point>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
        Cluster::Cluster((Cluster *)&p.y,pvVar7);
        Cluster::find_mass_centre
                  ((Point *)&values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(Cluster *)&p.y);
        Cluster::find_vectors((vector<double,_std::allocator<double>_> *)local_588,(Cluster *)&p.y);
        poVar5 = (ostream *)std::ostream::operator<<(local_420,p.eps);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,p.x);
        poVar5 = std::operator<<(poVar5," ");
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_588,0);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
        poVar5 = std::operator<<(poVar5," ");
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_588,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        poVar5 = (ostream *)std::ostream::operator<<(local_420,p.eps);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,p.x);
        poVar5 = std::operator<<(poVar5," ");
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_588,2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
        poVar5 = std::operator<<(poVar5," ");
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_588,3);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*pvVar8);
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)local_588);
        Cluster::~Cluster((Cluster *)&p.y);
      }
    }
    for (g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        iVar2 = g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
        sVar6 = std::vector<Cluster,_std::allocator<Cluster>_>::size(&this->clusters),
        iVar2 < (int)sVar6;
        g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage._4_4_ =
             g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      iVar2 = rand();
      iVar3 = rand();
      iVar4 = rand();
      pvVar7 = std::vector<Cluster,_std::allocator<Cluster>_>::operator[]
                         (&this->clusters,
                          (long)g_1.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage._4_4_);
      Cluster::Cluster((Cluster *)local_5a8,pvVar7);
      for (local_5ac = 0;
          sVar6 = std::vector<Point,_std::allocator<Point>_>::size
                            ((vector<Point,_std::allocator<Point>_> *)local_5a8),
          local_5ac < (int)sVar6; local_5ac = local_5ac + 1) {
        pvVar9 = std::vector<Point,_std::allocator<Point>_>::operator[]
                           ((vector<Point,_std::allocator<Point>_> *)local_5a8,(long)local_5ac);
        poVar5 = (ostream *)std::ostream::operator<<((ostream *)out,pvVar9->x);
        poVar5 = std::operator<<(poVar5," ");
        pvVar9 = std::vector<Point,_std::allocator<Point>_>::operator[]
                           ((vector<Point,_std::allocator<Point>_> *)local_5a8,(long)local_5ac);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,pvVar9->y);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4 % 0x101);
        poVar5 = std::operator<<(poVar5," ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      Cluster::~Cluster((Cluster *)local_5a8);
    }
  }
  std::ofstream::close();
  std::ofstream::close();
  std::ofstream::close();
  std::__cxx11::string::~string((string *)local_490);
  std::__cxx11::string::~string((string *)local_450);
  std::ofstream::~ofstream(local_420);
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Wave::print_clusters(ofstream &out,string filename) {
        ofstream out_gnu;
        ofstream out_arrow;
        string arrow_name=filename.substr(0, filename.find_last_of('.')) + "_arrow";
        string filename_gnu = filename.substr(0, filename.find_last_of('.')) + "_gnu.plt";
        out_gnu.open(filename_gnu);
        out_arrow.open(arrow_name);
        out_gnu << "rgb(r,g,b) = 65536 * int(r) + 256 * int(g) + int(b)" << endl;

        out_gnu << "plot '/Users/AlinaArslanova/untitled1/cmake-build-debug/" + filename +
                   "' using 1:2:(rgb($3,$4,$5))  notitle with points lc rgb variable, ";
        out_gnu
                << " '/Users/AlinaArslanova/untitled1/cmake-build-debug/"+arrow_name+"' using 1:2:3:4 with vectors head filled  lw 2  lc rgb \"red\"";
        out.open(filename);
        //log("printing clusters to " + filename);


        int a, b, c;
    if (!out.is_open()) {
        cout << "Errors in opening" << endl;
    } else {

        for (int i = 0; i < (int) clusters.size(); i++) {
            if (clusters[i].points.size() > 10) {

                Cluster g = clusters[i];
                Point p=g.find_mass_centre();
                vector<double> values=g.find_vectors();
                out_arrow << p.x << " " << p.y<< " "<<values[0] << " "<<values[1]<< endl;
                out_arrow << p.x << " " << p.y<< " "<<values[2] << " "<<values[3]<< endl;

            }
        }

        for (int i = 0; i < (int) clusters.size(); i++) {

            a = rand() % 257;
            b = rand() % 257;
            c = rand() % 257;
            Cluster g = clusters[i];
            for (int j = 0; j < (int) g.points.size(); j++) {

                out << g.points[j].x << " " << g.points[j].y << " " << a << " " << b << " " << c << " " << endl;
            }


        }


    }
    out.close();
    out_arrow.close();
    out_gnu.close();

}